

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<Fad<double>_> * __thiscall
Fad<Fad<double>>::operator=
          (Fad<Fad<double>> *this,
          FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
          *fadexpr)

{
  uint uVar1;
  Fad<Fad<double>_> *pFVar2;
  double *pdVar3;
  uint ssize;
  ulong uVar4;
  value_type local_58;
  Fad<Fad<double>_> *local_38;
  
  uVar1 = (((((fadexpr->fadexpr_).left_)->fadexpr_).expr_)->dx_).num_elts;
  ssize = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if ((int)ssize < (int)uVar1) {
    ssize = uVar1;
  }
  if (ssize != *(uint *)(this + 0x28)) {
    Vector<Fad<double>_>::resize((Vector<Fad<double>_> *)(this + 0x28),ssize);
  }
  local_38 = (Fad<Fad<double>_> *)this;
  if (ssize != 0) {
    pdVar3 = *(double **)(this + 0x30);
    if (((((((fadexpr->fadexpr_).left_)->fadexpr_).expr_)->dx_).num_elts == 0) ||
       ((((fadexpr->fadexpr_).right_)->dx_).num_elts == 0)) {
      if (0 < (int)ssize) {
        uVar4 = 0;
        do {
          FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>::dx
                    (&local_58,&fadexpr->fadexpr_,(int)uVar4);
          *pdVar3 = local_58.val_;
          Vector<double>::operator=((Vector<double> *)(pdVar3 + 1),&local_58.dx_);
          pdVar3[3] = local_58.defaultVal;
          Fad<double>::~Fad(&local_58);
          uVar4 = uVar4 + 1;
          pdVar3 = pdVar3 + 4;
        } while (ssize != uVar4);
      }
    }
    else if (0 < (int)ssize) {
      uVar4 = 0;
      do {
        FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>::fastAccessDx
                  (&local_58,&fadexpr->fadexpr_,(int)uVar4);
        *pdVar3 = local_58.val_;
        Vector<double>::operator=((Vector<double> *)(pdVar3 + 1),&local_58.dx_);
        pdVar3[3] = local_58.defaultVal;
        Fad<double>::~Fad(&local_58);
        uVar4 = uVar4 + 1;
        pdVar3 = pdVar3 + 4;
      } while (ssize != uVar4);
    }
  }
  FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>::val
            (&local_58,&fadexpr->fadexpr_);
  pFVar2 = local_38;
  (local_38->val_).val_ = local_58.val_;
  Vector<double>::operator=(&(local_38->val_).dx_,&local_58.dx_);
  (pFVar2->val_).defaultVal = local_58.defaultVal;
  Fad<double>::~Fad(&local_58);
  return pFVar2;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}